

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * flatbuffers::GenTextFile(Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  uint8_t *flatbuffer;
  char *pcVar2;
  string text;
  string local_48;
  
  if ((parser->opts).use_flexbuffers == true) {
    text._M_dataplus._M_p = (pointer)&text.field_2;
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    flexbuffers::Reference::ToString
              (&parser->flex_root_,true,(parser->opts).strict_json,&text,false,0,"",false);
    TextFileName(&local_48,path,file_name);
    bVar1 = SaveFile(local_48._M_dataplus._M_p,text._M_dataplus._M_p,text._M_string_length,true);
  }
  else {
    if ((parser->builder_).buf_.size_ == 0) {
      return (char *)0x0;
    }
    if (parser->root_struct_def_ == (StructDef *)0x0) {
      return (char *)0x0;
    }
    text._M_dataplus._M_p = (pointer)&text.field_2;
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser->builder_);
    pcVar2 = GenText(parser,flatbuffer,&text);
    if (pcVar2 != (char *)0x0) goto LAB_00151da8;
    TextFileName(&local_48,path,file_name);
    bVar1 = SaveFile(local_48._M_dataplus._M_p,text._M_dataplus._M_p,text._M_string_length,false);
  }
  pcVar2 = (char *)0x0;
  if (bVar1 == false) {
    pcVar2 = "SaveFile failed";
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_00151da8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  return pcVar2;
}

Assistant:

const char *GenTextFile(const Parser &parser, const std::string &path,
                             const std::string &file_name) {
  if (parser.opts.use_flexbuffers) {
    std::string json;
    parser.flex_root_.ToString(true, parser.opts.strict_json, json);
    return flatbuffers::SaveFile(TextFileName(path, file_name).c_str(),
                                 json.c_str(), json.size(), true)
               ? nullptr
               : "SaveFile failed";
  }
  if (!parser.builder_.GetSize() || !parser.root_struct_def_) return nullptr;
  std::string text;
  auto err = GenText(parser, parser.builder_.GetBufferPointer(), &text);
  if (err) return err;
  return flatbuffers::SaveFile(TextFileName(path, file_name).c_str(), text,
                               false)
             ? nullptr
             : "SaveFile failed";
}